

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr1502.cpp
# Opt level: O0

void ComputeFk(IkReal *j,IkReal *eetrans,IkReal *eerot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  IkReal x51;
  IkReal x50;
  IkReal x49;
  IkReal x48;
  IkReal x47;
  IkReal x46;
  IkReal x45;
  IkReal x44;
  IkReal x43;
  IkReal x42;
  IkReal x41;
  IkReal x40;
  IkReal x39;
  IkReal x38;
  IkReal x37;
  IkReal x36;
  IkReal x35;
  IkReal x34;
  IkReal x33;
  IkReal x32;
  IkReal x31;
  IkReal x30;
  IkReal x29;
  IkReal x28;
  IkReal x27;
  IkReal x26;
  IkReal x25;
  IkReal x24;
  IkReal x23;
  IkReal x22;
  IkReal x21;
  IkReal x20;
  IkReal x19;
  IkReal x18;
  IkReal x17;
  IkReal x16;
  IkReal x15;
  IkReal x14;
  IkReal x13;
  IkReal x12;
  IkReal x11;
  IkReal x10;
  IkReal x9;
  IkReal x8;
  IkReal x7;
  IkReal x6;
  IkReal x5;
  IkReal x4;
  IkReal x3;
  IkReal x2;
  IkReal x1;
  IkReal x0;
  IkReal *eerot_local;
  IkReal *eetrans_local;
  IkReal *j_local;
  
  dVar1 = IKcos(*j);
  dVar2 = IKcos(j[1]);
  dVar3 = IKsin(j[2]);
  dVar4 = IKcos(j[2]);
  dVar5 = IKsin(j[1]);
  dVar6 = IKsin(j[3]);
  dVar7 = IKcos(j[3]);
  dVar8 = IKsin(*j);
  dVar9 = IKsin(j[4]);
  dVar10 = IKcos(j[4]);
  dVar11 = IKsin(j[5]);
  dVar12 = IKcos(j[5]);
  dVar13 = dVar4 * 0.23;
  dVar14 = dVar7 * 1.0;
  dVar15 = dVar8 * 1.0;
  dVar16 = dVar3 * 0.055;
  dVar17 = dVar3 * 1.0;
  dVar18 = dVar2 * dVar8;
  dVar19 = dVar2 * dVar4;
  dVar20 = dVar3 * dVar5;
  dVar21 = dVar1 * dVar2;
  dVar3 = dVar2 * dVar3;
  dVar22 = dVar4 * dVar5;
  dVar23 = dVar20 - dVar19;
  dVar24 = dVar1 * (dVar17 * -1.0 * dVar5 + dVar19);
  dVar25 = dVar18 * dVar4 - dVar15 * dVar20;
  dVar26 = dVar17 * -1.0 * dVar21 + dVar1 * 1.0 * -1.0 * dVar22;
  dVar27 = dVar15 * (dVar22 * -1.0 - dVar3);
  dVar28 = dVar24 * dVar9;
  dVar29 = dVar26 * dVar6 + dVar7 * dVar8;
  dVar30 = dVar1 * 1.0 * -1.0 * dVar6 + dVar14 * -1.0 * dVar27;
  dVar31 = (dVar14 * -1.0 * dVar26 + dVar15 * dVar6) * dVar10;
  *eerot = dVar24 * dVar10 + dVar9 * (dVar26 * dVar7 - dVar15 * dVar6);
  eerot[1] = dVar12 * dVar29 + dVar11 * (dVar31 * -1.0 - dVar28);
  eerot[2] = dVar12 * (dVar28 + dVar31) + dVar11 * dVar29;
  *eetrans = dVar1 * -0.055 * dVar22 +
             dVar9 * (dVar7 * 0.23 * dVar26 + dVar8 * 0.23 * -1.0 * dVar6) +
             dVar10 * (dVar1 * -0.23 * dVar20 + dVar13 * dVar21) +
             dVar1 * 1.1 * -1.0 * dVar20 +
             dVar16 * -1.0 * dVar21 + dVar1 * 1.1 * dVar19 + dVar1 * 0.35 + dVar21 * 1.25;
  eerot[3] = dVar30 * dVar9 + dVar10 * (dVar15 * -1.0 * dVar19 + dVar15 * dVar20);
  eerot[4] = dVar12 * (dVar1 * dVar14 - dVar27 * dVar6) +
             dVar11 * (dVar30 * dVar10 + dVar25 * dVar9);
  eerot[5] = dVar11 * (dVar1 * dVar14 - dVar27 * dVar6) +
             dVar12 * (dVar9 * -1.0 * dVar25 +
                      dVar10 * -1.0 * (dVar27 * -1.0 * dVar7 - dVar1 * dVar6));
  eetrans[1] = dVar18 * -1.1 * dVar4 +
               dVar9 * (dVar7 * 0.23 * -1.0 * dVar27 + dVar1 * dVar6 * -0.23) +
               dVar18 * -1.25 +
               dVar22 * 0.055 * dVar8 +
               dVar8 * -0.35 +
               dVar10 * (dVar13 * -1.0 * dVar18 + dVar8 * 0.23 * dVar20) +
               dVar16 * dVar18 + dVar20 * 1.1 * dVar8;
  eerot[6] = dVar7 * dVar9 * dVar23 + dVar10 * (dVar2 * -1.0 * dVar17 - dVar22);
  eerot[7] = dVar12 * dVar23 * dVar6 + dVar11 * ((dVar3 + dVar22) * dVar9 + dVar23 * dVar7 * dVar10)
  ;
  eerot[8] = dVar12 * (dVar9 * -1.0 * (dVar3 + dVar22) + dVar10 * -1.0 * dVar23 * dVar7) +
             dVar11 * dVar23 * dVar6;
  eetrans[2] = dVar5 * -1.25 +
               dVar22 * -1.1 +
               dVar3 * -1.1 +
               dVar10 * (dVar5 * -1.0 * dVar13 * 1.0 + dVar3 * -0.23) +
               dVar19 * -0.055 +
               dVar7 * dVar9 * (dVar2 * -1.0 * dVar13 * 1.0 + dVar20 * 0.23) + dVar16 * dVar5 + 0.75
  ;
  return;
}

Assistant:

IKFAST_API void ComputeFk(const IkReal* j, IkReal* eetrans, IkReal* eerot) {
IkReal x0,x1,x2,x3,x4,x5,x6,x7,x8,x9,x10,x11,x12,x13,x14,x15,x16,x17,x18,x19,x20,x21,x22,x23,x24,x25,x26,x27,x28,x29,x30,x31,x32,x33,x34,x35,x36,x37,x38,x39,x40,x41,x42,x43,x44,x45,x46,x47,x48,x49,x50;
x0=IKcos(j[0]);
x1=IKcos(j[1]);
x2=IKsin(j[2]);
x3=IKcos(j[2]);
x4=IKsin(j[1]);
x5=IKsin(j[3]);
x6=IKcos(j[3]);
x7=IKsin(j[0]);
x8=IKsin(j[4]);
x9=IKcos(j[4]);
x10=IKsin(j[5]);
x11=IKcos(j[5]);
x12=((0.23)*x3);
x13=((1.0)*x6);
x14=((1.1)*x0);
x15=((0.23)*x6);
x16=((1.0)*x7);
x17=((0.23)*x7);
x18=((0.055)*x2);
x19=((1.0)*x2);
x20=((1.0)*x0);
x21=(x0*x5);
x22=(x1*x7);
x23=(x1*x3);
x24=((-1.0)*x9);
x25=(x2*x4);
x26=(x0*x1);
x27=((-1.0)*x8);
x28=(x1*x2);
x29=(x3*x4);
x30=(x6*x8);
x31=(x16*x5);
x32=(x0*x13);
x33=(x16*x25);
x34=((((-1.0)*x23))+x25);
x35=(x28+x29);
x36=(x34*x5);
x37=(x34*x6);
x38=(x0*(((((-1.0)*x19*x4))+x23)));
x39=((((-1.0)*x33))+((x22*x3)));
x40=(x37*x9);
x41=((((-1.0)*x19*x26))+(((-1.0)*x20*x29)));
x42=(x16*(((((-1.0)*x28))+(((-1.0)*x29)))));
x43=(x38*x8);
x44=(x41*x6);
x45=(x42*x5);
x46=((-1.0)*x42);
x47=(((x41*x5))+((x6*x7)));
x48=(x31+(((-1.0)*x13*x41)));
x49=((((-1.0)*x20*x5))+(((-1.0)*x13*x42)));
x50=(x48*x9);
eerot[0]=(((x38*x9))+((x8*(((((-1.0)*x31))+x44)))));
eerot[1]=(((x11*x47))+((x10*(((((-1.0)*x43))+(((-1.0)*x50)))))));
eerot[2]=(((x11*((x43+x50))))+((x10*x47)));
eetrans[0]=((((0.35)*x0))+(((1.25)*x26))+((x14*x23))+(((-1.0)*x18*x26))+(((-1.0)*x14*x25))+((x9*(((((-0.23)*x0*x25))+((x12*x26))))))+((x8*((((x15*x41))+(((-1.0)*x17*x5))))))+(((-0.055)*x0*x29)));
eerot[3]=(((x49*x8))+((x9*(((((-1.0)*x16*x23))+x33)))));
eerot[4]=(((x11*(((((-1.0)*x45))+x32))))+((x10*((((x49*x9))+((x39*x8)))))));
eerot[5]=(((x10*(((((-1.0)*x45))+x32))))+((x11*((((x27*x39))+((x24*(((((-1.0)*x21))+((x46*x6)))))))))));
eetrans[1]=(((x18*x22))+(((1.1)*x25*x7))+((x9*(((((-1.0)*x12*x22))+((x17*x25))))))+(((-0.35)*x7))+(((0.055)*x29*x7))+(((-1.25)*x22))+((x8*(((((-1.0)*x15*x42))+(((-0.23)*x21))))))+(((-1.1)*x22*x3)));
eerot[6]=(((x30*x34))+((x9*(((((-1.0)*x29))+(((-1.0)*x1*x19)))))));
eerot[7]=(((x11*x36))+((x10*((((x35*x8))+x40)))));
eerot[8]=(((x11*((((x27*x35))+((x24*x37))))))+((x10*x36)));
IkReal x51=((1.0)*x12);
eetrans[2]=((0.75)+((x18*x4))+((x30*(((((-1.0)*x1*x51))+(((0.23)*x25))))))+(((-0.055)*x23))+((x9*(((((-1.0)*x4*x51))+(((-0.23)*x28))))))+(((-1.1)*x28))+(((-1.1)*x29))+(((-1.25)*x4)));
}